

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

int __thiscall QDockWidgetLayout::minimumTitleWidth(QDockWidgetLayout *this)

{
  char cVar1;
  QLayoutItem *pQVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QWidget *this_00;
  undefined4 extraout_var;
  ulong uVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar11;
  QStyle *pQVar12;
  undefined8 uVar13;
  int iVar14;
  int unaff_R15D;
  long *plVar9;
  
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  pQVar2 = (this->item_list).d.ptr[3];
  if (pQVar2 == (QLayoutItem *)0x0) {
    plVar9 = (long *)0x0;
  }
  else {
    iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
    plVar9 = (long *)CONCAT44(extraout_var,iVar4);
  }
  if (plVar9 != (long *)0x0) {
    cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
    uVar10 = (**(code **)(*plVar9 + 0x78))(plVar9);
    uVar3 = uVar10 >> 0x20;
    if (cVar1 == '\0') {
      uVar3 = uVar10;
    }
    unaff_R15D = (int)uVar3;
  }
  if (plVar9 == (long *)0x0) {
    iVar5 = 0;
    iVar4 = 0;
    uVar13 = 0;
    if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x260) & 1) != 0) {
      pQVar2 = (this->item_list).d.ptr[1];
      iVar4 = 0;
      uVar13 = 0;
      if (pQVar2 != (QLayoutItem *)0x0) {
        iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
        uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x70))
                           ((long *)CONCAT44(extraout_var_00,iVar4));
        iVar4 = (int)((ulong)uVar13 >> 0x20);
      }
    }
    if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x260) & 4) == 0) {
      iVar14 = 0;
    }
    else {
      pQVar2 = (this->item_list).d.ptr[2];
      iVar14 = 0;
      if (pQVar2 != (QLayoutItem *)0x0) {
        iVar5 = (*pQVar2->_vptr_QLayoutItem[0xd])();
        uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x70))
                           ((long *)CONCAT44(extraout_var_01,iVar5));
        iVar14 = (int)uVar11;
        iVar5 = (int)((ulong)uVar11 >> 0x20);
      }
    }
    iVar6 = titleHeight(this);
    pQVar12 = QWidget::style(this_00);
    iVar7 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x46,0,this_00);
    pQVar12 = QWidget::style(this_00);
    iVar8 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x12,0,this_00);
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') {
      iVar5 = iVar14;
      iVar4 = (int)uVar13;
    }
    unaff_R15D = iVar5 + iVar4 + iVar7 * 3 + iVar6 + iVar8 * 2;
  }
  return unaff_R15D;
}

Assistant:

int QDockWidgetLayout::minimumTitleWidth() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return pick(verticalTitleBar, title->minimumSizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (hasFeature(q, QDockWidget::DockWidgetClosable)) {
        if (QLayoutItem *item = item_list[CloseButton])
            closeSize = item->widget()->sizeHint();
    }
    if (hasFeature(q, QDockWidget::DockWidgetFloatable)) {
        if (QLayoutItem *item = item_list[FloatButton])
            floatSize = item->widget()->sizeHint();
    }

    int titleHeight = this->titleHeight();

    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);
    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    return pick(verticalTitleBar, closeSize)
            + pick(verticalTitleBar, floatSize)
            + titleHeight + 2*fw + 3*mw;
}